

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O3

bool chrono::utils::WriteMeshPovray
               (string *obj_filename,string *mesh_name,string *out_dir,ChColor *col,
               ChVector<double> *pos,ChQuaternion<double> *rot)

{
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  ChGeometry local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)&stack0xffffffffffffffc0,obj_filename,false,false);
  if ((ChTriangleMeshConnected *)local_40._vptr_ChGeometry != (ChTriangleMeshConnected *)0x0) {
    WriteMeshPovray((ChTriangleMeshConnected *)local_40._vptr_ChGeometry,mesh_name,out_dir,col,pos,
                    rot,false);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return (ChTriangleMeshConnected *)local_40._vptr_ChGeometry != (ChTriangleMeshConnected *)0x0;
}

Assistant:

bool WriteMeshPovray(const std::string& obj_filename,
                     const std::string& mesh_name,
                     const std::string& out_dir,
                     const ChColor& col,
                     const ChVector<>& pos,
                     const ChQuaternion<>& rot) {
    // Read trimesh from OBJ file
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, false, false);
    if (!trimesh)
        return false;

    // Generate output
    WriteMeshPovray(*trimesh, mesh_name, out_dir, col, pos, rot);

    return true;
}